

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_progress.c
# Opt level: O2

void time2str(char *r,curl_off_t seconds)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  if (seconds < 1) {
    builtin_strncpy(r,"--:--:--",9);
    return;
  }
  if ((ulong)seconds < 360000) {
    uVar1 = (seconds & 0xffffffffU) / 0xe10;
    uVar3 = uVar1 * -0xe10 + seconds;
    lVar2 = (long)(int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                       0x3c);
    curl_msnprintf(r,9,"%2ld:%02ld:%02ld",uVar1,lVar2,lVar2 * -0x3c + uVar3);
    return;
  }
  if ((ulong)seconds < 86400000) {
    curl_msnprintf(r,9,"%3ldd %02ldh",(ulong)seconds / 0x15180,((ulong)seconds % 0x15180) / 0xe10);
    return;
  }
  curl_msnprintf(r,9,"%7ldd");
  return;
}

Assistant:

static void time2str(char *r, curl_off_t seconds)
{
  curl_off_t h;
  if(seconds <= 0) {
    strcpy(r, "--:--:--");
    return;
  }
  h = seconds / CURL_OFF_T_C(3600);
  if(h <= CURL_OFF_T_C(99)) {
    curl_off_t m = (seconds - (h*CURL_OFF_T_C(3600))) / CURL_OFF_T_C(60);
    curl_off_t s = (seconds - (h*CURL_OFF_T_C(3600))) - (m*CURL_OFF_T_C(60));
    msnprintf(r, 9, "%2" CURL_FORMAT_CURL_OFF_T ":%02" CURL_FORMAT_CURL_OFF_T
              ":%02" CURL_FORMAT_CURL_OFF_T, h, m, s);
  }
  else {
    /* this equals to more than 99 hours, switch to a more suitable output
       format to fit within the limits. */
    curl_off_t d = seconds / CURL_OFF_T_C(86400);
    h = (seconds - (d*CURL_OFF_T_C(86400))) / CURL_OFF_T_C(3600);
    if(d <= CURL_OFF_T_C(999))
      msnprintf(r, 9, "%3" CURL_FORMAT_CURL_OFF_T
                "d %02" CURL_FORMAT_CURL_OFF_T "h", d, h);
    else
      msnprintf(r, 9, "%7" CURL_FORMAT_CURL_OFF_T "d", d);
  }
}